

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

bool __thiscall
flatbuffers::Table::VerifyOffset<unsigned_int>(Table *this,Verifier *verifier,voffset_t field)

{
  voffset_t start;
  size_t sVar1;
  undefined1 local_1d;
  voffset_t field_offset;
  voffset_t field_local;
  Verifier *verifier_local;
  Table *this_local;
  
  start = GetOptionalFieldOffset(this,field);
  local_1d = true;
  if (start != 0) {
    sVar1 = VerifierTemplate<false>::VerifyOffset<unsigned_int>(verifier,(uint8_t *)this,start);
    local_1d = sVar1 != 0;
  }
  return local_1d;
}

Assistant:

bool VerifyOffset(const Verifier &verifier, voffset_t field) const {
    auto field_offset = GetOptionalFieldOffset(field);
    return !field_offset || verifier.VerifyOffset<OffsetT>(data_, field_offset);
  }